

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O1

void PatternMatch_CStyleParam(KonohaContext *kctx,KonohaStack *sfp)

{
  int iVar1;
  kNameSpace *stmt;
  uintptr_t uVar2;
  kFunc *pkVar3;
  KClass *pKVar4;
  kObjectVar *tokenList;
  kmagicflag_t kVar5;
  uint uVar6;
  kNode *o;
  uintptr_t uVar7;
  kNameSpace *pkVar8;
  long lVar9;
  int iVar10;
  kNameSpace *ns;
  long lVar11;
  bool bVar12;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  stmt = (kNameSpace *)sfp[1].field_0.asException;
  uVar2 = sfp[2].field_1.unboxValue;
  pkVar3 = sfp[3].field_0.asFunc;
  uVar7 = sfp[4].field_1.unboxValue;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_CStyleParam",0x477,"tracing..");
  lVar11 = uVar7 << 0x20;
  lVar9 = *(long *)((long)&(pkVar3->env->h).magicflag + (lVar11 >> 0x1d));
  uVar7 = 0xffffffffffffffff;
  if (*(int *)(*(long *)(lVar9 + 0x38) + 0x20) == 7) {
    pKVar4 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
    pkVar8 = stmt;
    do {
      ns = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar8->importedNameSpaceList)->StmtNameSpace
      ;
      if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar8->importedNameSpaceList)->StmtNameSpace
          ->h).ct == pKVar4) break;
      pkVar8 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar8->packageId)->RootNodeNameSpace;
      ns = pkVar8;
    } while ((pkVar8->h).ct != pKVar4);
    tokenList = *(kObjectVar **)(lVar9 + 0x20);
    local_50 = 1;
    uVar6 = (int)((tokenList->field_1).fieldUnboxItems[0] >> 3) - 1;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    local_4c = uVar6;
    if ((int)uVar6 < 1) {
      bVar12 = true;
    }
    else {
      lVar9 = 0;
      iVar10 = 0;
      do {
        kVar5 = (&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[lVar9];
        iVar1 = *(int *)(kVar5 + 0x30);
        if (iVar1 == 0x29) {
          uVar6 = (uint)lVar9;
          local_4c = uVar6;
        }
        else if (iVar1 == 0x20) {
          *(undefined8 *)(kVar5 + 0x38) =
               *(undefined8 *)(*(long *)((*kctx->runtimeModels)[1].setupModelContext + 0xc0) + 0x38)
          ;
          iVar10 = iVar10 + 1;
        }
        if (iVar1 == 0x29) goto LAB_00116cba;
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)uVar6);
      bVar12 = iVar10 == 0;
    }
    if ((bVar12) && (1 < (int)uVar6)) {
      (*(kctx->platApi->GCModule).UpdateObjectField)
                (tokenList,
                 (kObjectVar *)(&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[uVar6],
                 *(kObjectVar **)((*kctx->runtimeModels)[1].setupModelContext + 0xc0));
      (&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[(int)local_4c] =
           *(kmagicflag_t *)((*kctx->runtimeModels)[1].setupModelContext + 0xc0);
      local_4c = local_4c + 1;
    }
LAB_00116cba:
    o = ParseNewNode(kctx,ns,(kArray *)tokenList,&local_50,local_4c,ParseMetaPatternOption,
                     (char *)0x0);
    kNode_AddParsedObject(kctx,(kNode *)stmt,(ksymbol_t)uVar2,(kObject_conflict *)o);
    uVar7 = lVar11 + 0x100000000 >> 0x20;
  }
  sfp[-4].field_1.unboxValue = uVar7;
  return;
}

Assistant:

static KMETHOD PatternMatch_CStyleParam(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	int returnIdx = -1;
	kToken *tk = tokenList->TokenItems[beginIdx];
	if(tk->resolvedSyntaxInfo->keyword == KSymbol_ParenthesisGroup) {
		KTokenSeq param = {kNode_ns(stmt), RangeGroup(tk->GroupTokenList)};
		CheckCStyleParam(kctx, &param);
		kNode *block = ParseNewNode(kctx, param.ns, param.tokenList, &param.beginIdx, param.endIdx, ParseMetaPatternOption, NULL);
		kNode_AddParsedObject(kctx, stmt, name, UPCAST(block));
		returnIdx = beginIdx + 1;
	}
	KReturnUnboxValue(returnIdx);
}